

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O1

uchar * nvpair_unpack_string(_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  size_t __maxlen;
  size_t sVar1;
  char *pcVar2;
  int *piVar3;
  
  if (nvp->nvp_type != 4) {
    __assert_fail("nvp->nvp_type == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x2fb,
                  "const unsigned char *nvpair_unpack_string(_Bool, nvpair_t *, const unsigned char *, size_t *)"
                 );
  }
  __maxlen = nvp->nvp_datasize;
  if ((__maxlen - 1 < *leftp) && (sVar1 = strnlen((char *)ptr,__maxlen), sVar1 == __maxlen - 1)) {
    pcVar2 = strdup((char *)ptr);
    nvp->nvp_data = (uint64_t)pcVar2;
    if (pcVar2 != (char *)0x0) {
      *leftp = *leftp - __maxlen;
      return ptr + __maxlen;
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char *
nvpair_unpack_string(bool isbe __unused, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp)
{

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_STRING);

	if (*leftp < nvp->nvp_datasize || nvp->nvp_datasize == 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	if (strnlen((const char *)ptr, nvp->nvp_datasize) !=
	    nvp->nvp_datasize - 1) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	nvp->nvp_data = (uint64_t)(uintptr_t)nv_strdup((const char *)ptr);
	if (nvp->nvp_data == 0)
		return (NULL);

	ptr += nvp->nvp_datasize;
	*leftp -= nvp->nvp_datasize;

	return (ptr);
}